

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>
  *table;
  Impl *pIVar1;
  AnnotatedHandler *pAVar2;
  Entry *pEVar3;
  AnnotatedHandler *pAVar4;
  bool bVar5;
  StructSchema schema_local;
  Fault f;
  Entry local_e8;
  DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> local_98;
  Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> local_80;
  Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> newHandler;
  ArrayPtr<const_char> local_40;
  
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->annotatedHandlers;
  local_80.disposer = (Disposer *)0x0;
  local_80.ptr = (AnnotatedHandler *)0x0;
  local_e8.key._0_8_ = (Exception *)0x10;
  local_e8.value.ptr.disposer = (Disposer *)0x0;
  local_e8.value.ptr.ptr = (AnnotatedHandler *)0x0;
  schema_local = schema;
  local_e8.key.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  kj::
  Table<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&newHandler,&table->table,
             (long)(pIVar1->annotatedHandlers).table.rows.builder.pos -
             (long)(pIVar1->annotatedHandlers).table.rows.builder.ptr >> 5,&local_e8,0xffffffff);
  pAVar2 = newHandler.ptr;
  pAVar4 = local_e8.value.ptr.ptr;
  if ((char)newHandler.disposer == '\x01') {
    pEVar3 = (table->table).rows.builder.ptr;
    _kjCondition.left = &pEVar3[(long)newHandler.ptr].value;
    local_e8.value.ptr.ptr = (AnnotatedHandler *)0x0;
    local_98.disposer = local_e8.value.ptr.disposer;
    local_98.ptr = pAVar4;
    bVar5 = pEVar3[(long)newHandler.ptr].value.ptr.ptr == (AnnotatedHandler *)0x0;
    _kjCondition.right = (None *)&kj::none;
    _kjCondition.op.content.ptr = anon_var_dwarf_43885;
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = !bVar5;
    if (bVar5) {
      Schema::getProto((Reader *)&newHandler,&schema_local.super_Schema);
      local_40 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&newHandler);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[32],capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x5ad,FAILED,"existing != kj::none",
                 "_kjCondition,\"cyclic JSON flattening detected\", schema.getProto().getDisplayName()"
                 ,&_kjCondition,(char (*) [32])"cyclic JSON flattening detected",(Reader *)&local_40
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::dispose(&local_98);
    pEVar3 = (table->table).rows.builder.ptr + (long)pAVar2;
  }
  else {
    pEVar3 = kj::
             Vector<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry>
             ::
             add<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry>
                       ((Vector<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry>
                         *)table,&local_e8);
  }
  kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::dispose(&local_e8.value.ptr);
  kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::dispose(&local_80);
  pAVar4 = (pEVar3->value).ptr.ptr;
  if (pAVar4 == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&newHandler,this,&schema_local,discriminator,unionDeclName,dependencies);
    pAVar4 = newHandler.ptr;
    newHandler.ptr = (AnnotatedHandler *)0x0;
    _kjCondition.right = (None *)pAVar4;
    kj::
    HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::
    find<capnp::StructSchema&>
              ((HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>
                *)&local_e8,(StructSchema *)&((this->impl).ptr)->annotatedHandlers);
    if ((Exception *)local_e8.key._0_8_ == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x5ba,FAILED,"impl->annotatedHandlers.find(schema) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_e8);
    }
    kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::operator=
              ((Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> *)local_e8.key._0_8_,
               (Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> *)&_kjCondition);
    kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::dispose
              ((Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t> *)&_kjCondition);
    addTypeHandler(this,schema_local,&pAVar4->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
    kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>::dispose(&newHandler);
  }
  return pAVar4;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, kj::none,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != kj::none,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_SOME(v, entry.value) {
    // Already exists.
    return *v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }